

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

void __thiscall Corrade::Utility::Error::Error(Error *this,String *output,Flags flags)

{
  ostream *poVar1;
  byte bVar2;
  StringStream *this_00;
  byte bVar3;
  long in_FS_OFFSET;
  
  poVar1 = *(ostream **)(in_FS_OFFSET + -0x20);
  (this->super_Debug)._flags._value = flags._value;
  (this->super_Debug)._immediateFlags = '\x04';
  (this->super_Debug)._internalFlags = '\0';
  (this->super_Debug)._sourceLocationLine = 0;
  (this->super_Debug)._sourceLocationFile = (char *)0x0;
  (this->super_Debug)._previousGlobalOutput = poVar1;
  (this->super_Debug)._output = poVar1;
  (this->super_Debug)._previousColor = *(Color *)(in_FS_OFFSET + -8);
  if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
    (this->super_Debug)._internalFlags._value = '\b';
    bVar3 = 0x18;
    bVar2 = 8;
  }
  else {
    bVar3 = 0x10;
    bVar2 = 0;
  }
  if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
    (this->super_Debug)._internalFlags._value = bVar3;
    bVar2 = bVar3;
  }
  this->_previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
  if (output == (String *)0x0) {
    this_00 = (StringStream *)0x0;
  }
  else {
    this_00 = (StringStream *)operator_new(0x178);
    StringStream::StringStream(this_00,output);
    bVar2 = (this->super_Debug)._internalFlags._value;
  }
  (this->super_Debug)._output = &this_00->super_ostream;
  *(StringStream **)(in_FS_OFFSET + -0x10) = this_00;
  (this->super_Debug)._internalFlags._value = bVar2 | 1;
  return;
}

Assistant:

Error::Error(Containers::String* const output, const Flags flags): Debug{flags} {
    /* Save previous global output and replace it with current one */
    _previousGlobalErrorOutput = debugGlobals.errorOutput;
    /** @todo any better idea how to do these two lines without duplicating
        them in Debug, Warning and Error? */
    debugGlobals.errorOutput = _output = output ? new StringStream{*output} : nullptr;
    _internalFlags |= InternalFlag::OwnedStream;
}